

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unix_address.cpp
# Opt level: O2

result<sockpp::unix_address> *
sockpp::unix_address::create(result<sockpp::unix_address> *__return_storage_ptr__,string *path)

{
  unix_address uStack_88;
  
  if (path->_M_string_length < 0x6d) {
    unix_address(&uStack_88,path);
    result<sockpp::unix_address>::result(__return_storage_ptr__,&uStack_88);
  }
  else {
    result<sockpp::unix_address>::result(__return_storage_ptr__,invalid_argument);
  }
  return __return_storage_ptr__;
}

Assistant:

result<unix_address> unix_address::create(const string& path) {
    if (path.length() > MAX_PATH_NAME)
        return errc::invalid_argument;

    return unix_address{path};
}